

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O3

void Update_Chan_Algo3(ym2612_ *YM2612,channel_ *CH,DEV_SMPL **buf,UINT32 length)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  if (length != 0 && CH->SLOT[3].Ecnt != 0x20000000) {
    uVar6 = 0;
    do {
      iVar5 = CH->SLOT[0].Fcnt;
      YM2612->in0 = iVar5;
      iVar3 = CH->SLOT[2].Fcnt;
      YM2612->in1 = iVar3;
      iVar1 = CH->SLOT[1].Fcnt;
      YM2612->in2 = iVar1;
      iVar2 = CH->SLOT[3].Fcnt;
      YM2612->in3 = iVar2;
      CH->SLOT[0].Fcnt = iVar5 + CH->SLOT[0].Finc;
      CH->SLOT[2].Fcnt = iVar3 + CH->SLOT[2].Finc;
      CH->SLOT[1].Fcnt = iVar1 + CH->SLOT[1].Finc;
      CH->SLOT[3].Fcnt = iVar2 + CH->SLOT[3].Finc;
      iVar5 = CH->SLOT[0].Ecnt;
      iVar3 = CH->SLOT[2].Ecnt;
      auVar9._0_4_ = ENV_TAB[iVar5 >> 0x10] + CH->SLOT[0].TLL;
      auVar9._4_4_ = ENV_TAB[iVar3 >> 0x10] + CH->SLOT[2].TLL;
      auVar9._8_4_ = ENV_TAB[*(short *)((long)&CH->SLOT[1].Ecnt + 2)] + CH->SLOT[1].TLL;
      auVar9._12_4_ = ENV_TAB[*(short *)((long)&CH->SLOT[3].Ecnt + 2)] + CH->SLOT[3].TLL;
      auVar8._0_4_ = -(uint)((int)DAT_0017bba0 < auVar9._0_4_);
      auVar8._4_4_ = -(uint)(DAT_0017bba0._4_4_ < auVar9._4_4_);
      auVar8._8_4_ = -(uint)(DAT_0017bba0._8_4_ < auVar9._8_4_);
      auVar8._12_4_ = -(uint)(DAT_0017bba0._12_4_ < auVar9._12_4_);
      auVar7._0_4_ = (CH->SLOT[0].SEG << 0x1d) >> 0x1f;
      auVar7._4_4_ = (CH->SLOT[2].SEG << 0x1d) >> 0x1f;
      auVar7._8_4_ = (CH->SLOT[1].SEG << 0x1d) >> 0x1f;
      auVar7._12_4_ = (CH->SLOT[3].SEG << 0x1d) >> 0x1f;
      auVar7 = ~auVar7 & auVar9 | ~auVar8 & (auVar9 ^ _DAT_0017bba0) & auVar7;
      YM2612->en0 = auVar7._0_4_;
      YM2612->en1 = auVar7._4_4_;
      YM2612->en2 = auVar7._8_4_;
      YM2612->en3 = auVar7._12_4_;
      iVar5 = iVar5 + CH->SLOT[0].Einc;
      CH->SLOT[0].Ecnt = iVar5;
      if (CH->SLOT[0].Ecmp <= iVar5) {
        (*ENV_NEXT_EVENT[CH->SLOT[0].Ecurp])(YM2612,CH->SLOT);
        iVar3 = CH->SLOT[2].Ecnt;
      }
      iVar3 = iVar3 + CH->SLOT[2].Einc;
      CH->SLOT[2].Ecnt = iVar3;
      if (CH->SLOT[2].Ecmp <= iVar3) {
        (*ENV_NEXT_EVENT[CH->SLOT[2].Ecurp])(YM2612,CH->SLOT + 2);
      }
      iVar5 = CH->SLOT[1].Ecnt + CH->SLOT[1].Einc;
      CH->SLOT[1].Ecnt = iVar5;
      if (CH->SLOT[1].Ecmp <= iVar5) {
        (*ENV_NEXT_EVENT[CH->SLOT[1].Ecurp])(YM2612,CH->SLOT + 1);
      }
      iVar5 = CH->SLOT[3].Ecnt + CH->SLOT[3].Einc;
      CH->SLOT[3].Ecnt = iVar5;
      if (CH->SLOT[3].Ecmp <= iVar5) {
        (*ENV_NEXT_EVENT[CH->SLOT[3].Ecurp])(YM2612,CH->SLOT + 3);
      }
      YM2612->in0 = YM2612->in0 + (CH->S0_OUT[1] + CH->S0_OUT[0] >> ((byte)CH->FB & 0x1f));
      iVar5 = CH->S0_OUT[0];
      CH->S0_OUT[1] = iVar5;
      CH->S0_OUT[0] =
           *(int *)(*(long *)((long)SIN_TAB + (ulong)((uint)YM2612->in0 >> 0xb & 0x7ff8)) +
                   (long)YM2612->en0 * 4);
      uVar4 = iVar5 + YM2612->in1;
      YM2612->in1 = uVar4;
      uVar4 = *(int *)(*(long *)((long)SIN_TAB + (ulong)((uint)YM2612->in2 >> 0xb & 0x7ff8)) +
                      (long)YM2612->en2 * 4) +
              *(int *)(*(long *)((long)SIN_TAB + (ulong)(uVar4 >> 0xb & 0x7ff8)) +
                      (long)YM2612->en1 * 4) + YM2612->in3;
      YM2612->in3 = uVar4;
      uVar4 = *(int *)(*(long *)((long)SIN_TAB + (ulong)(uVar4 >> 0xb & 0x7ff8)) +
                      (long)YM2612->en3 * 4) >> 0xf;
      CH->OUTd = uVar4;
      (*buf)[uVar6] = (*buf)[uVar6] + (uVar4 & CH->LEFT);
      buf[1][uVar6] = buf[1][uVar6] + (CH->RIGHT & CH->OUTd);
      uVar6 = uVar6 + 1;
    } while (length != uVar6);
  }
  return;
}

Assistant:

static void Update_Chan_Algo3(ym2612_ *YM2612, channel_ *CH, DEV_SMPL **buf, UINT32 length)
{
  UINT32 i;

  if (CH->SLOT[S3].Ecnt == ENV_END)
    return;

#if YM_DEBUG_LEVEL > 1
  fprintf(debug_file, "\n\nAlgo 3 len = %d\n\n", length);
#endif

  for (i = 0; i < length; i++)
  {
    GET_CURRENT_PHASE
    UPDATE_PHASE
    GET_CURRENT_ENV
    UPDATE_ENV
    DO_ALGO_3
    DO_OUTPUT
  }
}